

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::Fixed64CasesWithSizes_ReadLittleEndian64_Test::TestBody
          (Fixed64CasesWithSizes_ReadLittleEndian64_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  ParamType *pPVar3;
  __tuple_element_t<0UL,_tuple<Fixed64Case,_int>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<Fixed64Case,_int>_> *p_Var5;
  char *pcVar6;
  char *in_R9;
  AssertHelper local_150;
  Message local_148;
  int64_t local_140 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  uint64_t value;
  undefined1 local_a0 [8];
  CodedInputStream coded_input;
  ArrayInputStream input;
  int kBlockSizes_case;
  Fixed64Case kFixed64Cases_case;
  Fixed64CasesWithSizes_ReadLittleEndian64_Test *this_local;
  
  pPVar3 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
           ::GetParam();
  p_Var4 = std::get<0ul,google::protobuf::io::(anonymous_namespace)::Fixed64Case,int>(pPVar3);
  uVar1 = *(undefined8 *)p_Var4->bytes;
  kFixed64Cases_case.bytes = (uint8_t  [8])p_Var4->value;
  pPVar3 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
           ::GetParam();
  p_Var5 = std::get<1ul,google::protobuf::io::(anonymous_namespace)::Fixed64Case,int>(pPVar3);
  _buffer_ = uVar1;
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&coded_input.extension_factory_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*p_Var5);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_a0,(ZeroCopyInputStream *)&coded_input.extension_factory_);
  local_c9 = CodedInputStream::ReadLittleEndian64
                       ((CodedInputStream *)local_a0,(uint64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_c8,
               (AssertionResult *)"coded_input.ReadLittleEndian64(&value)","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x26e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_110,"kFixed64Cases_case.value","value",
             (unsigned_long *)&kFixed64Cases_case,(unsigned_long *)&gtest_ar_.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x26f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_a0);
  local_140[1] = 8;
  local_140[0] = ArrayInputStream::ByteCount((ArrayInputStream *)&coded_input.extension_factory_);
  testing::internal::EqHelper::Compare<unsigned_long,_long,_nullptr>
            ((EqHelper *)local_130,"sizeof(uint64_t)","input.ByteCount()",
             (unsigned_long *)(local_140 + 1),local_140);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_148);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x272,pcVar6);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_input.extension_factory_);
  return;
}

Assistant:

TEST_P(Fixed64CasesWithSizes, ReadLittleEndian64) {
  Fixed64Case kFixed64Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kFixed64Cases_case.bytes, sizeof(kFixed64Cases_case.bytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadLittleEndian64(&value));
    EXPECT_EQ(kFixed64Cases_case.value, value);
  }

  EXPECT_EQ(sizeof(uint64_t), input.ByteCount());
}